

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O0

int CfdUncompressPubkey(void *handle,char *pubkey,char **output)

{
  bool bVar1;
  undefined8 uVar2;
  CfdException *this;
  char *pcVar3;
  undefined8 *in_RDX;
  char *in_RSI;
  CfdException *except;
  exception *std_except;
  Pubkey key;
  string *in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  CfdError error_code;
  allocator *paVar4;
  CfdException *in_stack_fffffffffffffea0;
  string *in_stack_fffffffffffffee0;
  string local_110;
  allocator local_e9;
  string local_e8;
  Pubkey local_c8;
  undefined1 local_aa;
  allocator local_a9;
  string local_a8 [32];
  CfdSourceLocation local_88;
  undefined1 local_6a;
  allocator local_69;
  string local_68 [32];
  CfdSourceLocation local_48;
  undefined8 *local_20;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  if (local_20 == (undefined8 *)0x0) {
    local_48.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_48.filename = local_48.filename + 1;
    local_48.line = 0x506;
    local_48.funcname = "CfdUncompressPubkey";
    cfd::core::logger::warn<>(&local_48,"output is null.");
    local_6a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"Failed to parameter. output is null.",&local_69);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffea0,error_code,in_stack_fffffffffffffe90);
    local_6a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (!bVar1) {
    paVar4 = &local_e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e8,local_18,paVar4);
    cfd::core::Pubkey::Pubkey(&local_c8,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    cfd::core::Pubkey::Uncompress((Pubkey *)&stack0xfffffffffffffed8,&local_c8);
    cfd::core::Pubkey::GetHex_abi_cxx11_(&local_110,(Pubkey *)&stack0xfffffffffffffed8);
    pcVar3 = cfd::capi::CreateString(in_stack_fffffffffffffee0);
    *local_20 = pcVar3;
    std::__cxx11::string::~string((string *)&local_110);
    cfd::core::Pubkey::~Pubkey((Pubkey *)0x5d7f1b);
    local_4 = 0;
    cfd::core::Pubkey::~Pubkey((Pubkey *)0x5d7f33);
    return local_4;
  }
  local_88.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
               ,0x2f);
  local_88.filename = local_88.filename + 1;
  local_88.line = 0x50c;
  local_88.funcname = "CfdUncompressPubkey";
  cfd::core::logger::warn<>(&local_88,"pubkey is null or empty.");
  local_aa = 1;
  this = (CfdException *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"Failed to parameter. pubkey is null or empty.",&local_a9);
  cfd::core::CfdException::CfdException(this,error_code,in_stack_fffffffffffffe90);
  local_aa = 0;
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdUncompressPubkey(void* handle, const char* pubkey, char** output) {
  try {
    cfd::Initialize();
    if (output == nullptr) {
      warn(CFD_LOG_SOURCE, "output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. output is null.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }

    Pubkey key(pubkey);
    *output = CreateString(key.Uncompress().GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}